

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

bool bssl::anon_unknown_0::CacheEquals
               (SSL_CTX *ctx,vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *expected)

{
  SSL_SESSION **ppSVar1;
  bool bVar2;
  ssl_session_st *psVar3;
  pointer ppsVar4;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *__range2;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> expected_copy;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> actual;
  _Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_48;
  _Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_28;
  
  psVar3 = ctx->session_cache_head;
  for (ppsVar4 = (expected->super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
      ppsVar4 !=
      (expected->super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppsVar4 = ppsVar4 + 1) {
    if (psVar3 != *ppsVar4) goto LAB_00164bdf;
    ppSVar1 = &psVar3->next;
    psVar3 = *ppSVar1;
    if (*ppSVar1 == (SSL_SESSION *)&ctx->session_cache_tail) {
      psVar3 = (SSL_SESSION *)0x0;
    }
  }
  if (psVar3 == (ssl_session_st *)0x0) {
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lh_SSL_SESSION_doall_arg(ctx->sessions,AppendSession,&local_28);
    std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::operator=
              ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&local_48,expected);
    std::
    __sort<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_28._M_impl.super__Vector_impl_data._M_start,
               local_28._M_impl.super__Vector_impl_data._M_finish);
    std::
    __sort<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_finish);
    bVar2 = std::operator==((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&local_28
                            ,(vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)
                             &local_48);
    std::_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~_Vector_base(&local_48)
    ;
    std::_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~_Vector_base(&local_28)
    ;
  }
  else {
LAB_00164bdf:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool CacheEquals(SSL_CTX *ctx,
                        const std::vector<SSL_SESSION *> &expected) {
  // Check the linked list.
  SSL_SESSION *ptr = ctx->session_cache_head;
  for (SSL_SESSION *session : expected) {
    if (ptr != session) {
      return false;
    }
    // TODO(davidben): This is an absurd way to denote the end of the list.
    if (ptr->next ==
        reinterpret_cast<SSL_SESSION *>(&ctx->session_cache_tail)) {
      ptr = nullptr;
    } else {
      ptr = ptr->next;
    }
  }
  if (ptr != nullptr) {
    return false;
  }

  // Check the hash table.
  std::vector<SSL_SESSION *> actual, expected_copy;
  lh_SSL_SESSION_doall_arg(ctx->sessions, AppendSession, &actual);
  expected_copy = expected;

  std::sort(actual.begin(), actual.end());
  std::sort(expected_copy.begin(), expected_copy.end());

  return actual == expected_copy;
}